

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O0

ByteData *
cfd::core::WallyUtil::MulTweakPrivkey
          (ByteData *__return_storage_ptr__,ByteData *privkey,ByteData256 *tweak)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  ByteData local_48;
  Secp256k1 local_30;
  Secp256k1 secp256k1;
  secp256k1_context_struct *context;
  ByteData256 *tweak_local;
  ByteData *privkey_local;
  
  secp256k1.secp256k1_context_ = wally_get_secp_context();
  Secp256k1::Secp256k1(&local_30,secp256k1.secp256k1_context_);
  ByteData256::GetBytes(&local_60,tweak);
  ByteData::ByteData(&local_48,&local_60);
  Secp256k1::MulTweakPrivkeySecp256k1Ec(__return_storage_ptr__,&local_30,privkey,&local_48);
  ByteData::~ByteData((ByteData *)0x3f9726);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&privkey->data_);
  return __return_storage_ptr__;
}

Assistant:

ByteData WallyUtil::MulTweakPrivkey(
    const ByteData& privkey, const ByteData256& tweak) {
  struct secp256k1_context_struct* context = wally_get_secp_context();
  Secp256k1 secp256k1(context);
  return secp256k1.MulTweakPrivkeySecp256k1Ec(
      privkey, ByteData(tweak.GetBytes()));
}